

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

HighsBasis * __thiscall
HEkk::getHighsBasis(HighsBasis *__return_storage_ptr__,HEkk *this,HighsLp *use_lp)

{
  double *pdVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ObjSense OVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pcVar9;
  pointer pcVar10;
  pointer pdVar11;
  pointer pHVar12;
  HighsInt iVar;
  size_type sVar13;
  HighsBasisStatus HVar14;
  size_type __new_size;
  
  iVar4 = use_lp->num_col_;
  __new_size = (size_type)iVar4;
  iVar5 = use_lp->num_row_;
  __return_storage_ptr__->valid = false;
  __return_storage_ptr__->alien = true;
  __return_storage_ptr__->useful = false;
  __return_storage_ptr__->was_alien = true;
  __return_storage_ptr__->debug_id = -1;
  __return_storage_ptr__->debug_update_count = -1;
  (__return_storage_ptr__->debug_origin_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->debug_origin_name).field_2;
  *(undefined4 *)&(__return_storage_ptr__->debug_origin_name).field_2 = 0x656e6f4e;
  (__return_storage_ptr__->debug_origin_name)._M_string_length = 4;
  (__return_storage_ptr__->debug_origin_name).field_2._M_local_buf[4] = '\0';
  (__return_storage_ptr__->col_status).
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->col_status).
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->col_status).
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->row_status).
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->row_status).
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->row_status).
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&__return_storage_ptr__->col_status,__new_size);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&__return_storage_ptr__->row_status,(long)iVar5);
  __return_storage_ptr__->valid = false;
  if (0 < iVar4) {
    pdVar7 = (use_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (use_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar9 = (this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar10 = (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    OVar6 = (this->lp_).sense_;
    pdVar11 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar12 = (__return_storage_ptr__->col_status).
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar13 = 0;
    do {
      if (pcVar9[sVar13] == '\0') {
        HVar14 = kBasic;
      }
      else {
        cVar3 = pcVar10[sVar13];
        if (cVar3 == -1) {
          HVar14 = kUpper;
        }
        else if (cVar3 == '\x01') {
          HVar14 = kLower;
        }
        else if (cVar3 == '\0') {
          dVar2 = pdVar7[sVar13];
          pdVar1 = pdVar8 + sVar13;
          if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
            HVar14 = kZero;
          }
          else {
            HVar14 = (pdVar11[sVar13] * (double)OVar6 < 0.0) * '\x02';
          }
        }
        else {
          HVar14 = kNonbasic;
        }
      }
      pHVar12[sVar13] = HVar14;
      sVar13 = sVar13 + 1;
    } while (__new_size != sVar13);
  }
  if (0 < iVar5) {
    pdVar7 = (use_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (use_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    OVar6 = (this->lp_).sense_;
    pHVar12 = (__return_storage_ptr__->row_status).
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar9 = (this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar10 = (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar13 = 0;
    do {
      if (pcVar9[sVar13 + __new_size] == '\0') {
        HVar14 = kBasic;
      }
      else {
        cVar3 = pcVar10[sVar13 + __new_size];
        if (cVar3 == -1) {
          HVar14 = kLower;
        }
        else if (cVar3 == '\x01') {
          HVar14 = kUpper;
        }
        else if (cVar3 == '\0') {
          dVar2 = pdVar7[sVar13];
          pdVar1 = pdVar8 + sVar13;
          if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
            HVar14 = kZero;
          }
          else {
            HVar14 = (pdVar11[__new_size + sVar13] * (double)OVar6 < 0.0) * '\x02';
          }
        }
        else {
          HVar14 = kNonbasic;
        }
      }
      pHVar12[sVar13] = HVar14;
      sVar13 = sVar13 + 1;
    } while ((long)iVar5 != sVar13);
  }
  __return_storage_ptr__->valid = true;
  __return_storage_ptr__->alien = false;
  __return_storage_ptr__->useful = true;
  __return_storage_ptr__->was_alien = false;
  __return_storage_ptr__->debug_id =
       (int)(this->build_synthetic_tick_ + this->total_synthetic_tick_);
  __return_storage_ptr__->debug_update_count = (this->info_).update_count;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->debug_origin_name);
  return __return_storage_ptr__;
}

Assistant:

HighsBasis HEkk::getHighsBasis(HighsLp& use_lp) const {
  HighsInt num_col = use_lp.num_col_;
  HighsInt num_row = use_lp.num_row_;
  HighsBasis highs_basis;
  highs_basis.col_status.resize(num_col);
  highs_basis.row_status.resize(num_row);
  assert(status_.has_basis);
  highs_basis.valid = false;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    HighsInt iVar = iCol;
    const double lower = use_lp.col_lower_[iCol];
    const double upper = use_lp.col_upper_[iCol];
    HighsBasisStatus basis_status = HighsBasisStatus::kNonbasic;
    if (!basis_.nonbasicFlag_[iVar]) {
      basis_status = HighsBasisStatus::kBasic;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveUp) {
      basis_status = HighsBasisStatus::kLower;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveDn) {
      basis_status = HighsBasisStatus::kUpper;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveZe) {
      if (lower == upper) {
        const double dual = (HighsInt)lp_.sense_ * info_.workDual_[iCol];
        basis_status =
            dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
      } else {
        basis_status = HighsBasisStatus::kZero;
      }
    }
    highs_basis.col_status[iCol] = basis_status;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    const double lower = use_lp.row_lower_[iRow];
    const double upper = use_lp.row_upper_[iRow];
    HighsBasisStatus basis_status = HighsBasisStatus::kNonbasic;
    if (!basis_.nonbasicFlag_[iVar]) {
      basis_status = HighsBasisStatus::kBasic;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveUp) {
      basis_status = HighsBasisStatus::kUpper;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveDn) {
      basis_status = HighsBasisStatus::kLower;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveZe) {
      if (lower == upper) {
        const double dual = (HighsInt)lp_.sense_ * info_.workDual_[iVar];
        basis_status =
            dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
      } else {
        basis_status = HighsBasisStatus::kZero;
      }
    }
    highs_basis.row_status[iRow] = basis_status;
  }
  highs_basis.valid = true;
  highs_basis.alien = false;
  highs_basis.useful = true;
  highs_basis.was_alien = false;
  highs_basis.debug_id =
      (HighsInt)(build_synthetic_tick_ + total_synthetic_tick_);
  highs_basis.debug_update_count = info_.update_count;
  highs_basis.debug_origin_name = basis_.debug_origin_name;
  return highs_basis;
}